

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O0

void __thiscall ymfm::ym3526::generate(ym3526 *this,output_data *output,uint32_t numsamples)

{
  ymfm_output<1> *output_00;
  uint local_20;
  uint32_t samp;
  uint32_t numsamples_local;
  output_data *output_local;
  ym3526 *this_local;
  
  _samp = output;
  for (local_20 = 0; local_20 < numsamples; local_20 = local_20 + 1) {
    fm_engine_base<ymfm::opl_registers_base<1>_>::clock(&this->m_fm);
    output_00 = ymfm_output<1>::clear(_samp);
    fm_engine_base<ymfm::opl_registers_base<1>_>::output(&this->m_fm,output_00,1,0x7fff,0x1ff);
    ymfm_output<1>::roundtrip_fp(_samp);
    _samp = _samp + 1;
  }
  return;
}

Assistant:

void ym3526::generate(output_data *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		// clock the system
		m_fm.clock(fm_engine::ALL_CHANNELS);

		// update the FM content; mixing details for YM3526 need verification
		m_fm.output(output->clear(), 1, 32767, fm_engine::ALL_CHANNELS);

		// YM3526 uses an external DAC (YM3014) with mantissa/exponent format
		// convert to 10.3 floating point value and back to simulate truncation
		output->roundtrip_fp();
	}
}